

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_ldm.cpp
# Opt level: O2

size_t duckdb_zstd::ZSTD_ldm_blockCompress
                 (rawSeqStore_t *rawSeqStore,ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,
                 ZSTD_paramSwitch_e useRowMatchFinder,void *src,size_t srcSize)

{
  BYTE *pBVar1;
  rawSeq *prVar2;
  uint minMatch;
  uint uVar3;
  BYTE *pBVar4;
  undefined8 uVar5;
  ZSTD_blockCompressor UNRECOVERED_JUMPTABLE;
  size_t sVar6;
  long lVar7;
  BYTE *pBVar8;
  ZSTD_dictMode_e dictMode;
  BYTE *pBVar9;
  seqDef *psVar10;
  BYTE *pBVar11;
  BYTE *pBVar12;
  ulong uVar14;
  ulong uVar15;
  BYTE *pBVar16;
  ulong uVar17;
  uint uVar18;
  ulong uVar19;
  ulong local_60;
  U32 UVar13;
  
  if ((ms->window).lowLimit < (ms->window).dictLimit) {
    dictMode = ZSTD_extDict;
  }
  else if (ms->dictMatchState == (ZSTD_matchState_t *)0x0) {
    dictMode = ZSTD_noDict;
  }
  else {
    dictMode = ZSTD_dedicatedDictSearch - (ms->dictMatchState->dedicatedDictSearch == 0);
  }
  minMatch = (ms->cParams).minMatch;
  UNRECOVERED_JUMPTABLE =
       ZSTD_selectBlockCompressor((ms->cParams).strategy,useRowMatchFinder,dictMode);
  if (6 < (int)(ms->cParams).strategy) {
    ms->ldmSeqStore = rawSeqStore;
    sVar6 = (*UNRECOVERED_JUMPTABLE)(ms,seqStore,rep,src,srcSize);
    ZSTD_ldm_skipRawSeqStoreBytes(rawSeqStore,srcSize);
    return sVar6;
  }
  pBVar16 = (BYTE *)(srcSize + (long)src);
  pBVar1 = pBVar16 + -0x20;
  while( true ) {
    uVar14 = rawSeqStore->pos;
    uVar19 = (long)pBVar16 - (long)src;
    if ((rawSeqStore->size <= uVar14) || (pBVar16 <= src)) break;
    prVar2 = rawSeqStore->seq + uVar14;
    uVar15._0_4_ = prVar2->offset;
    uVar15._4_4_ = prVar2->litLength;
    uVar17 = uVar15 >> 0x20;
    uVar3 = rawSeqStore->seq[uVar14].matchLength;
    local_60 = (ulong)uVar3;
    uVar18 = (uint)uVar19;
    if (uVar18 < uVar3 + uVar15._4_4_) {
      uVar14 = uVar15;
      if (uVar18 - uVar15._4_4_ < minMatch) {
        uVar14 = 0;
      }
      if (uVar18 < (uint)uVar15._4_4_ || uVar18 - uVar15._4_4_ == 0) {
        uVar14 = 0;
      }
      else {
        local_60 = (ulong)(uVar18 - uVar15._4_4_);
      }
      ZSTD_ldm_skipSequences(rawSeqStore,uVar19 & 0xffffffff,minMatch);
      uVar15 = uVar14;
    }
    else {
      rawSeqStore->pos = uVar14 + 1;
    }
    UVar13 = (U32)uVar15;
    if (UVar13 == 0) break;
    ZSTD_ldm_limitTableUpdate(ms,(BYTE *)src);
    ZSTD_ldm_fillFastTables(ms,src);
    sVar6 = (*UNRECOVERED_JUMPTABLE)(ms,seqStore,rep,src,uVar17);
    for (lVar7 = 8; lVar7 != 0; lVar7 = lVar7 + -4) {
      *(undefined4 *)((long)rep + lVar7) = *(undefined4 *)((long)rep + lVar7 + -4);
    }
    pBVar8 = (BYTE *)((long)src + uVar17);
    *rep = UVar13;
    pBVar11 = pBVar8 + -sVar6;
    pBVar4 = seqStore->lit;
    if (pBVar1 < pBVar8) {
      pBVar9 = pBVar4;
      pBVar12 = pBVar11;
      if (pBVar11 <= pBVar1) {
        pBVar9 = pBVar4 + ((long)pBVar1 - (long)pBVar11);
        uVar5 = *(undefined8 *)(pBVar11 + 8);
        *(undefined8 *)pBVar4 = *(undefined8 *)pBVar11;
        *(undefined8 *)(pBVar4 + 8) = uVar5;
        pBVar12 = pBVar1;
        if (0x10 < (long)pBVar1 - (long)pBVar11) {
          lVar7 = 0x10;
          do {
            uVar5 = *(undefined8 *)((BYTE *)((long)src + lVar7 + (uVar17 - sVar6)) + 8);
            pBVar11 = pBVar4 + lVar7;
            *(undefined8 *)pBVar11 = *(undefined8 *)((long)src + lVar7 + (uVar17 - sVar6));
            *(undefined8 *)(pBVar11 + 8) = uVar5;
            uVar5 = *(undefined8 *)((BYTE *)((long)src + lVar7 + (uVar17 - sVar6) + 0x10) + 8);
            *(undefined8 *)(pBVar11 + 0x10) =
                 *(undefined8 *)((long)src + lVar7 + (uVar17 - sVar6) + 0x10);
            *(undefined8 *)(pBVar11 + 0x18) = uVar5;
            lVar7 = lVar7 + 0x20;
          } while (pBVar11 + 0x20 < pBVar9);
        }
      }
      for (; pBVar12 < pBVar8; pBVar12 = pBVar12 + 1) {
        *pBVar9 = *pBVar12;
        pBVar9 = pBVar9 + 1;
      }
LAB_003d1bf6:
      seqStore->lit = seqStore->lit + sVar6;
      psVar10 = seqStore->sequences;
      if (0xffff < sVar6) {
        seqStore->longLengthType = ZSTD_llt_literalLength;
        seqStore->longLengthPos =
             (U32)((ulong)((long)psVar10 - (long)seqStore->sequencesStart) >> 3);
      }
    }
    else {
      uVar5 = *(undefined8 *)(pBVar11 + 8);
      *(undefined8 *)pBVar4 = *(undefined8 *)pBVar11;
      *(undefined8 *)(pBVar4 + 8) = uVar5;
      pBVar4 = seqStore->lit;
      if (0x10 < sVar6) {
        uVar5 = *(undefined8 *)(pBVar11 + 0x18);
        *(undefined8 *)(pBVar4 + 0x10) = *(undefined8 *)(pBVar11 + 0x10);
        *(undefined8 *)(pBVar4 + 0x18) = uVar5;
        if (0x20 < (long)sVar6) {
          lVar7 = 0;
          do {
            uVar5 = *(undefined8 *)((BYTE *)((long)src + lVar7 + (uVar17 - sVar6) + 0x20) + 8);
            pBVar11 = pBVar4 + lVar7 + 0x20;
            *(undefined8 *)pBVar11 = *(undefined8 *)((long)src + lVar7 + (uVar17 - sVar6) + 0x20);
            *(undefined8 *)(pBVar11 + 8) = uVar5;
            uVar5 = *(undefined8 *)((BYTE *)((long)src + lVar7 + (uVar17 - sVar6) + 0x30) + 8);
            *(undefined8 *)(pBVar11 + 0x10) =
                 *(undefined8 *)((long)src + lVar7 + (uVar17 - sVar6) + 0x30);
            *(undefined8 *)(pBVar11 + 0x18) = uVar5;
            lVar7 = lVar7 + 0x20;
          } while (pBVar11 + 0x20 < pBVar4 + sVar6);
        }
        goto LAB_003d1bf6;
      }
      seqStore->lit = pBVar4 + sVar6;
      psVar10 = seqStore->sequences;
    }
    psVar10->litLength = (U16)sVar6;
    psVar10->offBase = UVar13 + 3;
    if (0xffff < local_60 - 3) {
      seqStore->longLengthType = ZSTD_llt_matchLength;
      seqStore->longLengthPos = (U32)((ulong)((long)psVar10 - (long)seqStore->sequencesStart) >> 3);
    }
    psVar10->mlBase = (U16)(local_60 - 3);
    seqStore->sequences = psVar10 + 1;
    src = pBVar8 + local_60;
  }
  ZSTD_ldm_limitTableUpdate(ms,(BYTE *)src);
  ZSTD_ldm_fillFastTables(ms,src);
  sVar6 = (*UNRECOVERED_JUMPTABLE)(ms,seqStore,rep,src,uVar19);
  return sVar6;
}

Assistant:

size_t ZSTD_ldm_blockCompress(rawSeqStore_t* rawSeqStore,
    ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
    ZSTD_paramSwitch_e useRowMatchFinder,
    void const* src, size_t srcSize)
{
    const ZSTD_compressionParameters* const cParams = &ms->cParams;
    unsigned const minMatch = cParams->minMatch;
    ZSTD_blockCompressor const blockCompressor =
        ZSTD_selectBlockCompressor(cParams->strategy, useRowMatchFinder, ZSTD_matchState_dictMode(ms));
    /* Input bounds */
    BYTE const* const istart = (BYTE const*)src;
    BYTE const* const iend = istart + srcSize;
    /* Input positions */
    BYTE const* ip = istart;

    DEBUGLOG(5, "ZSTD_ldm_blockCompress: srcSize=%zu", srcSize);
    /* If using opt parser, use LDMs only as candidates rather than always accepting them */
    if (cParams->strategy >= ZSTD_btopt) {
        size_t lastLLSize;
        ms->ldmSeqStore = rawSeqStore;
        lastLLSize = blockCompressor(ms, seqStore, rep, src, srcSize);
        ZSTD_ldm_skipRawSeqStoreBytes(rawSeqStore, srcSize);
        return lastLLSize;
    }

    assert(rawSeqStore->pos <= rawSeqStore->size);
    assert(rawSeqStore->size <= rawSeqStore->capacity);
    /* Loop through each sequence and apply the block compressor to the literals */
    while (rawSeqStore->pos < rawSeqStore->size && ip < iend) {
        /* maybeSplitSequence updates rawSeqStore->pos */
        rawSeq const sequence = maybeSplitSequence(rawSeqStore,
                                                   (U32)(iend - ip), minMatch);
        /* End signal */
        if (sequence.offset == 0)
            break;

        assert(ip + sequence.litLength + sequence.matchLength <= iend);

        /* Fill tables for block compressor */
        ZSTD_ldm_limitTableUpdate(ms, ip);
        ZSTD_ldm_fillFastTables(ms, ip);
        /* Run the block compressor */
        DEBUGLOG(5, "pos %u : calling block compressor on segment of size %u", (unsigned)(ip-istart), sequence.litLength);
        {
            int i;
            size_t const newLitLength =
                blockCompressor(ms, seqStore, rep, ip, sequence.litLength);
            ip += sequence.litLength;
            /* Update the repcodes */
            for (i = ZSTD_REP_NUM - 1; i > 0; i--)
                rep[i] = rep[i-1];
            rep[0] = sequence.offset;
            /* Store the sequence */
            ZSTD_storeSeq(seqStore, newLitLength, ip - newLitLength, iend,
                          OFFSET_TO_OFFBASE(sequence.offset),
                          sequence.matchLength);
            ip += sequence.matchLength;
        }
    }
    /* Fill the tables for the block compressor */
    ZSTD_ldm_limitTableUpdate(ms, ip);
    ZSTD_ldm_fillFastTables(ms, ip);
    /* Compress the last literals */
    return blockCompressor(ms, seqStore, rep, ip, iend - ip);
}